

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-try-send.c
# Opt level: O0

int run_test_udp_try_send(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  undefined1 auStack_28 [4];
  int r;
  uv_buf_t buf;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)&buf.len);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
            ,0x57,"0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_udp_init(puVar2,&server);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
            ,0x5a,"r == 0");
    abort();
  }
  iVar1 = uv_udp_bind(&server,(sockaddr *)&buf.len,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
            ,0x5d,"r == 0");
    abort();
  }
  iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
            ,0x60,"r == 0");
    abort();
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)&buf.len);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
            ,0x62,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_udp_init(puVar2,&client);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
            ,0x65,"r == 0");
    abort();
  }
  uVar3 = uv_buf_init(run_test_udp_try_send::buffer,0x10000);
  local_40 = uVar3.base;
  _auStack_28 = local_40;
  local_38 = (char *)uVar3.len;
  buf.base = local_38;
  iVar1 = uv_udp_try_send(&client,(uv_buf_t *)auStack_28,1,(sockaddr *)&buf.len);
  if (iVar1 != -0x5a) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
            ,0x69,"r == UV_EMSGSIZE");
    abort();
  }
  uVar3 = uv_buf_init("EXIT",4);
  local_50 = uVar3.base;
  _auStack_28 = local_50;
  local_48 = (char *)uVar3.len;
  buf.base = local_48;
  iVar1 = uv_udp_try_send(&client,(uv_buf_t *)auStack_28,1,(sockaddr *)&buf.len);
  if (iVar1 != 4) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
            ,0x6d,"r == 4");
    abort();
  }
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  if (close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
            ,0x71,"close_cb_called == 2");
    abort();
  }
  if (sv_recv_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
            ,0x72,"sv_recv_cb_called == 1");
    abort();
  }
  if (client.send_queue_size != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
            ,0x74,"client.send_queue_size == 0");
    abort();
  }
  if (server.send_queue_size != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
            ,0x75,"server.send_queue_size == 0");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
            ,0x77,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(udp_try_send) {
  struct sockaddr_in addr;
  static char buffer[64 * 1024];
  uv_buf_t buf;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  buf = uv_buf_init(buffer, sizeof(buffer));
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &addr);
  ASSERT(r == UV_EMSGSIZE);

  buf = uv_buf_init("EXIT", 4);
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &addr);
  ASSERT(r == 4);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);
  ASSERT(sv_recv_cb_called == 1);

  ASSERT(client.send_queue_size == 0);
  ASSERT(server.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}